

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O0

int coda_cursor_get_bit_size(coda_cursor_conflict *cursor,int64_t *bit_size)

{
  coda_backend cVar1;
  int64_t *bit_size_local;
  coda_cursor_conflict *cursor_local;
  
  if (((cursor == (coda_cursor_conflict *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x659);
    cursor_local._4_4_ = -1;
  }
  else {
    cVar1 = (cursor->stack[cursor->n + -1].type)->backend;
    if (cVar1 == coda_backend_ascii) {
      cursor_local._4_4_ = coda_ascii_cursor_get_bit_size(cursor,bit_size);
    }
    else if (cVar1 == coda_backend_binary) {
      cursor_local._4_4_ = coda_bin_cursor_get_bit_size(cursor,bit_size);
    }
    else if (cVar1 == coda_backend_memory) {
      cursor_local._4_4_ = coda_mem_cursor_get_bit_size(cursor,bit_size);
    }
    else {
      if (cVar1 - coda_backend_hdf4 < 5) {
        *bit_size = -1;
      }
      cursor_local._4_4_ = 0;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_get_bit_size(cursor, bit_size);
        case coda_backend_binary:
            return coda_bin_cursor_get_bit_size(cursor, bit_size);
        case coda_backend_memory:
            return coda_mem_cursor_get_bit_size(cursor, bit_size);
        case coda_backend_hdf4:
        case coda_backend_hdf5:
        case coda_backend_cdf:
        case coda_backend_netcdf:
        case coda_backend_grib:
            *bit_size = -1;
            break;
    }

    return 0;
}